

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_next.c
# Opt level: O1

int mpt_slice_next(mpt_slice *s)

{
  mpt_buffer *pmVar1;
  ulong uVar2;
  mpt_type_traits *pmVar3;
  uintptr_t uVar4;
  int iVar5;
  mpt_type_traits *pmVar6;
  void *pvVar7;
  ulong uVar8;
  uintptr_t uVar9;
  size_t __n;
  void *__s;
  
  pmVar1 = (s->_a)._buf;
  if (pmVar1 != (mpt_buffer *)0x0) {
    uVar2 = s->_off;
    __n = pmVar1->_used - uVar2;
    if (-1 < (long)__n) {
      pmVar3 = pmVar1->_content_traits;
      if (pmVar3 == (mpt_type_traits *)0x0) {
        return -1;
      }
      uVar8 = pmVar3->size;
      if (uVar8 == 0) {
        return -1;
      }
      uVar9 = s->_len;
      if ((uVar9 == 0) || (__n = __n - uVar9, __n != 0)) {
        if ((long)__n < (long)uVar8) {
          return -0x10;
        }
        if (uVar8 == 1) {
          pmVar6 = mpt_type_traits(99);
          uVar9 = s->_off;
          if (pmVar3 == pmVar6) {
            uVar4 = s->_len;
            __s = (void *)((long)&pmVar1[1]._vptr + uVar4 + uVar9);
            pvVar7 = memchr(__s,0,__n);
            iVar5 = 0x73;
            uVar8 = (long)pvVar7 + (1 - (long)__s);
            if (pvVar7 == (void *)0x0) {
              iVar5 = 0x43;
              uVar8 = __n;
            }
            uVar9 = uVar9 + uVar4;
          }
          else {
            uVar9 = uVar9 + s->_len;
            iVar5 = 0x40;
            uVar8 = 1;
          }
        }
        else {
          if (uVar2 % uVar8 != 0) {
            return -2;
          }
          if ((long)(__n - uVar8) < 0) {
            return -0x10;
          }
          uVar9 = uVar9 + uVar2;
          iVar5 = 0x40;
        }
      }
      else {
        uVar9 = uVar9 + uVar2;
        uVar8 = 0;
        iVar5 = 0;
      }
      s->_off = uVar9;
      s->_len = uVar8;
      return iVar5;
    }
  }
  return -0x10;
}

Assistant:

extern int mpt_slice_next(MPT_STRUCT(slice) *s)
{
	const MPT_STRUCT(buffer) *buf;
	const MPT_STRUCT(type_traits) *traits;
	const char *base, *end;
	ssize_t len;
	
	/* no remaining data */
	if (!(buf = s->_a._buf)
	  || (len = buf->_used - s->_off) < 0) {
		return MPT_ERROR(MissingData);
	}
	if (!(traits = buf->_content_traits) || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* consume existing segment */
	if (s->_len) {
		len -= s->_len;
		if (!len) {
			s->_off += s->_len;
			s->_len = 0;
			return 0;
		}
	}
	if (len < (ssize_t) traits->size) {
		return MPT_ERROR(MissingData);
	}
	/* alignment of data is required */
	if (traits->size != 1) {
		if (s->_off % traits->size) {
			return MPT_ERROR(BadValue);
		}
		len -= traits->size;
		if (len < 0) {
			return MPT_ERROR(MissingData);
		}
		s->_off += s->_len;
		s->_len = traits->size;
		return MPT_ENUM(TypeVector);
	}
	/* next byte of remaining data */
	if (traits != mpt_type_traits('c')) {
		s->_off += s->_len;
		s->_len = 1;
		return MPT_ENUM(TypeVector);
	}
	/* element base address and range */
	base = ((char *) (buf + 1)) + s->_off + s->_len;
	if ((end = memchr(base, 0, len))) {
		len = end + 1 - base;
	}
	s->_off += s->_len;
	s->_len = len;
	return end ? 's' : MPT_type_toVector('c');
}